

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,CNetAddr *mask)

{
  byte bVar1;
  Network NVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  CSubNet *pCVar10;
  byte bVar11;
  byte bVar12;
  long in_FS_OFFSET;
  bool bVar13;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&this->network);
  this->valid = false;
  this->netmask[0] = '\0';
  this->netmask[1] = '\0';
  this->netmask[2] = '\0';
  this->netmask[3] = '\0';
  this->netmask[4] = '\0';
  this->netmask[5] = '\0';
  this->netmask[6] = '\0';
  this->netmask[7] = '\0';
  this->netmask[8] = '\0';
  this->netmask[9] = '\0';
  this->netmask[10] = '\0';
  this->netmask[0xb] = '\0';
  this->netmask[0xc] = '\0';
  this->netmask[0xd] = '\0';
  this->netmask[0xe] = '\0';
  this->netmask[0xf] = '\0';
  NVar2 = addr->m_net;
  if (NVar2 - NET_IPV4 < 2) {
    bVar13 = NVar2 == mask->m_net;
    this->valid = bVar13;
    if (bVar13) {
      uVar6 = (mask->m_addr)._size;
      if (0x10 < uVar6) {
        mask = (CNetAddr *)(mask->m_addr)._union.indirect_contents.indirect;
        uVar6 = uVar6 - 0x11;
      }
      if (uVar6 != 0) {
        sVar8 = 0;
        bVar13 = false;
        do {
          bVar1 = (mask->m_addr)._union.direct[sVar8];
          bVar11 = 1;
          bVar12 = 1;
          if (bVar1 < 0xe0) {
            if (bVar1 != 0) {
              bVar12 = bVar11;
              if ((bVar1 == 0x80) || (bVar1 == 0xc0)) goto switchD_00d75f79_caseD_f8;
              goto switchD_00d75f79_caseD_f9;
            }
          }
          else {
            bVar12 = bVar11;
            switch(bVar1) {
            case 0xf8:
            case 0xfc:
            case 0xfe:
              break;
            case 0xf9:
            case 0xfa:
            case 0xfb:
            case 0xfd:
              goto switchD_00d75f79_caseD_f9;
            case 0xff:
              bVar12 = 0;
              break;
            default:
              if ((bVar1 != 0xe0) && (bVar1 != 0xf0)) goto switchD_00d75f79_caseD_f9;
            }
switchD_00d75f79_caseD_f8:
            if (bVar13) goto switchD_00d75f79_caseD_f9;
          }
          bVar13 = (bool)(bVar13 | bVar12);
          sVar8 = sVar8 + 1;
        } while ((long)(int)uVar6 != sVar8);
        if (0x10 < uVar6) {
          __assert_fail("mask.m_addr.size() <= sizeof(netmask)",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                        ,0x3d6,"CSubNet::CSubNet(const CNetAddr &, const CNetAddr &)");
        }
      }
      memcpy(this->netmask,mask,(long)(int)uVar6);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,&addr->m_addr);
      uVar5 = addr->m_scope_id;
      (this->network).m_net = addr->m_net;
      (this->network).m_scope_id = uVar5;
      uVar6 = (this->network).m_addr._size;
      bVar13 = uVar6 < 0x11;
      uVar4 = uVar6 - 0x11;
      if (bVar13) {
        uVar4 = uVar6;
      }
      if (uVar4 != 0) {
        lVar7 = 0;
        uVar9 = 0;
        do {
          pCVar10 = this;
          if (!bVar13) {
            pCVar10 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
          }
          pCVar10->netmask[(lVar7 >> 0x20) + -0x20] =
               pCVar10->netmask[(lVar7 >> 0x20) + -0x20] & this->netmask[uVar9];
          uVar9 = uVar9 + 1;
          uVar6 = (this->network).m_addr._size;
          bVar13 = uVar6 < 0x11;
          uVar4 = uVar6 - 0x11;
          if (bVar13) {
            uVar4 = uVar6;
          }
          lVar7 = lVar7 + 0x100000000;
        } while (uVar9 < uVar4);
      }
    }
  }
  else {
switchD_00d75f79_caseD_f9:
    this->valid = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, const CNetAddr& mask) : CSubNet()
{
    valid = (addr.IsIPv4() || addr.IsIPv6()) && addr.m_net == mask.m_net;
    if (!valid) {
        return;
    }
    // Check if `mask` contains 1-bits after 0-bits (which is an invalid netmask).
    bool zeros_found = false;
    for (auto b : mask.m_addr) {
        const int num_bits = NetmaskBits(b);
        if (num_bits == -1 || (zeros_found && num_bits != 0)) {
            valid = false;
            return;
        }
        if (num_bits < 8) {
            zeros_found = true;
        }
    }

    assert(mask.m_addr.size() <= sizeof(netmask));

    memcpy(netmask, mask.m_addr.data(), mask.m_addr.size());

    network = addr;

    // Normalize network according to netmask
    for (size_t x = 0; x < network.m_addr.size(); ++x) {
        network.m_addr[x] &= netmask[x];
    }
}